

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

bool __thiscall DMessageBoxMenu::MenuEvent(DMessageBoxMenu *this,int mkey,bool fromcontroller)

{
  float volume;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  DMessageBoxMenu *pDStack_18;
  int mkey_local;
  DMessageBoxMenu *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pDStack_18 = this;
  if (this->mMessageMode == 0) {
    if ((mkey == 0) || (mkey == 1)) {
      FSoundID::FSoundID(&local_24,"menu/cursor");
      volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_24,volume,0.0);
      this->messageSelection = (uint)((this->messageSelection != 0 ^ 0xffU) & 1);
      this_local._7_1_ = true;
    }
    else if (mkey == 6) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xf])
                (this,(ulong)((this->messageSelection != 0 ^ 0xff) & 1));
      this_local._7_1_ = true;
    }
    else if (mkey == 7) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xf])(this,0);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    CloseSound(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DMessageBoxMenu::MenuEvent(int mkey, bool fromcontroller)
{
	if (mMessageMode == 0)
	{
		if (mkey == MKEY_Up || mkey == MKEY_Down)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			messageSelection = !messageSelection;
			return true;
		}
		else if (mkey == MKEY_Enter)
		{
			// 0 is yes, 1 is no
			HandleResult(!messageSelection);
			return true;
		}
		else if (mkey == MKEY_Back)
		{
			HandleResult(false);
			return true;
		}
		return false;
	}
	else
	{
		Close();
		CloseSound();
		return true;
	}
}